

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<char[12]>(XmlWriter *this,string *name,char (*attribute) [12])

{
  XmlWriter *pXVar1;
  string local_68;
  undefined1 local_38 [8];
  ReusableStringStream rss;
  char (*attribute_local) [12];
  string *name_local;
  XmlWriter *this_local;
  
  rss.m_oss = (ostream *)attribute;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_38);
  ReusableStringStream::operator<<((ReusableStringStream *)local_38,(char (*) [12])rss.m_oss);
  ReusableStringStream::str_abi_cxx11_(&local_68,(ReusableStringStream *)local_38);
  pXVar1 = writeAttribute(this,name,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_38);
  return pXVar1;
}

Assistant:

XmlWriter &writeAttribute(std::string const &name, T const &attribute) {
      ReusableStringStream rss;
      rss << attribute;
      return writeAttribute(name, rss.str());
    }